

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * google::protobuf::compiler::js::anon_unknown_0::ToEnumCase
                   (string *__return_storage_ptr__,string *input)

{
  ulong uVar1;
  char *pcVar2;
  undefined4 local_30;
  int i;
  string *input_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  for (local_30 = 0; uVar1 = std::__cxx11::string::size(), (ulong)(long)local_30 < uVar1;
      local_30 = local_30 + 1) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
    if ((*pcVar2 < 'a') ||
       (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input), 'z' < *pcVar2)) {
      std::__cxx11::string::operator[]((ulong)input);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    else {
      std::__cxx11::string::operator[]((ulong)input);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string ToEnumCase(const string& input) {
  string result;
  result.reserve(input.size());

  for (int i = 0; i < input.size(); i++) {
    if ('a' <= input[i] && input[i] <= 'z') {
      result.push_back(input[i] - 'a' + 'A');
    } else {
      result.push_back(input[i]);
    }
  }

  return result;
}